

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

void BN_set_params(int mul,int high,int low,int mont)

{
  int mont_local;
  int low_local;
  int high_local;
  int mult_local;
  
  if (-1 < mul) {
    mult_local = mul;
    if (0x1f < mul) {
      mult_local = 0x1f;
    }
    bn_limit_bits = mult_local;
    bn_limit_num = 1 << ((byte)mult_local & 0x1f);
  }
  if (-1 < high) {
    high_local = high;
    if (0x1f < high) {
      high_local = 0x1f;
    }
    bn_limit_bits_high = high_local;
    bn_limit_num_high = 1 << ((byte)high_local & 0x1f);
  }
  if (-1 < low) {
    low_local = low;
    if (0x1f < low) {
      low_local = 0x1f;
    }
    bn_limit_bits_low = low_local;
    bn_limit_num_low = 1 << ((byte)low_local & 0x1f);
  }
  if (-1 < mont) {
    mont_local = mont;
    if (0x1f < mont) {
      mont_local = 0x1f;
    }
    bn_limit_bits_mont = mont_local;
    bn_limit_num_mont = 1 << ((byte)mont_local & 0x1f);
  }
  return;
}

Assistant:

void BN_set_params(int mult, int high, int low, int mont)
{
    if (mult >= 0) {
        if (mult > (int)(sizeof(int) * 8) - 1)
            mult = sizeof(int) * 8 - 1;
        bn_limit_bits = mult;
        bn_limit_num = 1 << mult;
    }
    if (high >= 0) {
        if (high > (int)(sizeof(int) * 8) - 1)
            high = sizeof(int) * 8 - 1;
        bn_limit_bits_high = high;
        bn_limit_num_high = 1 << high;
    }
    if (low >= 0) {
        if (low > (int)(sizeof(int) * 8) - 1)
            low = sizeof(int) * 8 - 1;
        bn_limit_bits_low = low;
        bn_limit_num_low = 1 << low;
    }
    if (mont >= 0) {
        if (mont > (int)(sizeof(int) * 8) - 1)
            mont = sizeof(int) * 8 - 1;
        bn_limit_bits_mont = mont;
        bn_limit_num_mont = 1 << mont;
    }
}